

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaG_runerror(lua_State *L,char *fmt,...)

{
  char in_AL;
  lua_State *in_RCX;
  char *in_XMM1_Qa;
  lua_State *in_XMM1_Qb;
  __va_list_tag *unaff_retaddr;
  char *in_stack_00000008;
  lua_State *in_stack_00000010;
  va_list argp;
  char *in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff68 = in_XMM1_Qa;
    in_stack_ffffffffffffff70 = in_XMM1_Qb;
  }
  luaO_pushvfstring(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  addinfo(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  luaG_errormsg(in_RCX);
  return;
}

Assistant:

static void luaG_runerror(lua_State*L,const char*fmt,...){
va_list argp;
va_start(argp,fmt);
addinfo(L,luaO_pushvfstring(L,fmt,argp));
va_end(argp);
luaG_errormsg(L);
}